

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O1

void __thiscall
andres::
BinaryViewExpression<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_andres::marray_detail::Minus<float,_float,_float>_>
::BinaryViewExpression
          (BinaryViewExpression<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_andres::marray_detail::Minus<float,_float,_float>_>
           *this,ViewExpression<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float>
                 *e1,
          ViewExpression<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float> *e2)

{
  size_t sVar1;
  size_t sVar2;
  runtime_error *this_00;
  expression_type_1 *this_01;
  ulong dimension;
  
  this->e1_ = (expression_type_1 *)e1;
  this->e2_ = (expression_type_2 *)e2;
  if ((*(long *)(e1 + 0x30) == 0) || (*(long *)(e2 + 0x30) == 0)) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed.");
  }
  else if (*(long *)e1 == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed.");
  }
  else if (*(long *)e2 == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed.");
  }
  else if (*(long *)(e1 + 0x28) == *(long *)(e2 + 0x28)) {
    this_01 = this->e1_;
    if (this_01->data_ != (pointer)0x0) {
      dimension = 0;
      do {
        if ((this_01->geometry_).dimension_ <= dimension) {
          return;
        }
        sVar1 = View<float,_true,_std::allocator<unsigned_long>_>::shape(this_01,dimension);
        sVar2 = View<float,_true,_std::allocator<unsigned_long>_>::shape(this->e2_,dimension);
        if (sVar1 != sVar2) {
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_00,"Assertion failed.");
          goto LAB_001ff8fb;
        }
        dimension = dimension + 1;
        this_01 = this->e1_;
      } while (this_01->data_ != (pointer)0x0);
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed.");
  }
  else {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed.");
  }
LAB_001ff8fb:
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

BinaryViewExpression(const ViewExpression<E1, T1>& e1, 
        const ViewExpression<E2, T2>& e2) 
        : e1_(e1), e2_(e2), // cast!
          binaryFunctor_(BinaryFunctor()) 
        {
            if(!MARRAY_NO_DEBUG) {
                marray_detail::Assert(e1_.size() != 0 && e2_.size() != 0);
                marray_detail::Assert(e1_.dimension() == e2_.dimension());
                for(std::size_t j=0; j<e1_.dimension(); ++j) {
                    marray_detail::Assert(e1_.shape(j) == e2_.shape(j));
                }
            }
        }